

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void CompressTables(lemon *lemp)

{
  state *psVar1;
  bool bVar2;
  symbol *psVar3;
  action *paVar4;
  action **ppaVar5;
  int iVar6;
  int iVar7;
  action *paVar8;
  state *psVar9;
  action **ppaVar10;
  long lVar11;
  
  lVar11 = 0;
  do {
    if (lemp->nstate <= lVar11) {
      return;
    }
    psVar9 = (state *)0x0;
    iVar6 = 0;
    bVar2 = false;
    ppaVar10 = &lemp->sorted[lVar11]->ap;
    ppaVar5 = ppaVar10;
    while (paVar4 = *ppaVar5, paVar4 != (action *)0x0) {
      if (paVar4->type == REDUCE) {
        psVar1 = (paVar4->x).stp;
        if ((psVar1->statenum == 0) && (psVar1 != psVar9)) {
          iVar7 = 1;
          paVar8 = paVar4;
          while (paVar8 = paVar8->next, paVar8 != (action *)0x0) {
            if (paVar8->type == REDUCE) {
              iVar7 = iVar7 + (uint)((paVar8->x).stp == psVar1 && (paVar8->x).stp != psVar9);
            }
          }
          if (iVar6 < iVar7) {
            psVar9 = psVar1;
            iVar6 = iVar7;
          }
        }
      }
      else if ((paVar4->type == SHIFT) && (paVar4->sp == lemp->wildcard)) {
        bVar2 = true;
      }
      ppaVar5 = &paVar4->next;
    }
    if ((0 < iVar6) && (ppaVar5 = ppaVar10, !bVar2)) {
      while( true ) {
        paVar4 = *ppaVar5;
        if (paVar4 == (action *)0x0) {
          __assert_fail("ap",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/misc/lemon.c"
                        ,0x1057,"void CompressTables(struct lemon *)");
        }
        if ((paVar4->type == REDUCE) && ((paVar4->x).stp == psVar9)) break;
        ppaVar5 = &paVar4->next;
      }
      psVar3 = Symbol_new("{default}");
      paVar4->sp = psVar3;
      while (paVar4 = paVar4->next, paVar4 != (action *)0x0) {
        if ((paVar4->type == REDUCE) && ((paVar4->x).stp == psVar9)) {
          paVar4->type = NOT_USED;
        }
      }
      paVar4 = Action_sort(*ppaVar10);
      *ppaVar10 = paVar4;
    }
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

void CompressTables(struct lemon *lemp)
{
  struct state *stp;
  struct action *ap, *ap2;
  struct rule *rp, *rp2, *rbest;
  int nbest, n;
  int i;
  int usesWildcard;

  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    nbest = 0;
    rbest = 0;
    usesWildcard = 0;

    for(ap=stp->ap; ap; ap=ap->next){
      if( ap->type==SHIFT && ap->sp==lemp->wildcard ){
        usesWildcard = 1;
      }
      if( ap->type!=REDUCE ) continue;
      rp = ap->x.rp;
      if( rp->lhsStart ) continue;
      if( rp==rbest ) continue;
      n = 1;
      for(ap2=ap->next; ap2; ap2=ap2->next){
        if( ap2->type!=REDUCE ) continue;
        rp2 = ap2->x.rp;
        if( rp2==rbest ) continue;
        if( rp2==rp ) n++;
      }
      if( n>nbest ){
        nbest = n;
        rbest = rp;
      }
    }
 
    /* Do not make a default if the number of rules to default
    ** is not at least 1 or if the wildcard token is a possible
    ** lookahead.
    */
    if( nbest<1 || usesWildcard ) continue;


    /* Combine matching REDUCE actions into a single default */
    for(ap=stp->ap; ap; ap=ap->next){
      if( ap->type==REDUCE && ap->x.rp==rbest ) break;
    }
    assert( ap );
    ap->sp = Symbol_new("{default}");
    for(ap=ap->next; ap; ap=ap->next){
      if( ap->type==REDUCE && ap->x.rp==rbest ) ap->type = NOT_USED;
    }
    stp->ap = Action_sort(stp->ap);
  }
}